

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

double av1_estimate_coeff_entropy(double q_step,double b,double zero_bin_ratio,int qcoeff)

{
  int in_EDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double r_1;
  double z;
  double r;
  double z0;
  int abs_qcoeff;
  double in_stack_ffffffffffffff98;
  double local_8;
  
  if (in_EDI < 1) {
    in_EDI = -in_EDI;
  }
  dVar1 = exp_bounded(in_stack_ffffffffffffff98);
  if (dVar1 <= 1e-07) {
    dVar1 = 1e-07;
  }
  if (in_EDI == 0) {
    local_8 = log2(1.0 - dVar1);
    local_8 = -local_8;
  }
  else {
    dVar2 = exp_bounded(in_stack_ffffffffffffff98);
    if (dVar2 <= 1e-07) {
      dVar2 = 1e-07;
    }
    dVar1 = log2(dVar1);
    dVar1 = 1.0 - dVar1;
    dVar3 = log2(1.0 - dVar2);
    dVar2 = log2(dVar2);
    local_8 = -(double)(in_EDI + -1) * dVar2 + (dVar1 - dVar3);
  }
  return local_8;
}

Assistant:

double av1_estimate_coeff_entropy(double q_step, double b,
                                  double zero_bin_ratio, int qcoeff) {
  b = AOMMAX(b, TPL_EPSILON);
  int abs_qcoeff = abs(qcoeff);
  double z0 = fmax(exp_bounded(-zero_bin_ratio / 2 * q_step / b), TPL_EPSILON);
  if (abs_qcoeff == 0) {
    double r = -log2(1 - z0);
    return r;
  } else {
    double z = fmax(exp_bounded(-q_step / b), TPL_EPSILON);
    double r = 1 - log2(z0) - log2(1 - z) - (abs_qcoeff - 1) * log2(z);
    return r;
  }
}